

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX.cpp
# Opt level: O2

string * __thiscall
amrex::get_command_argument_abi_cxx11_(string *__return_storage_ptr__,amrex *this,int number)

{
  if ((int)this <
      (int)((ulong)(DAT_006e02b0 - ::(anonymous_namespace)::command_arguments_abi_cxx11_) >> 5)) {
    std::__cxx11::string::string
              ((string *)__return_storage_ptr__,
               (string *)
               (::(anonymous_namespace)::command_arguments_abi_cxx11_ + (long)(int)this * 0x20));
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    __return_storage_ptr__->_M_string_length = 0;
    (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  }
  return __return_storage_ptr__;
}

Assistant:

std::string
amrex::get_command_argument (int number)
{
    if (number < static_cast<int>(command_arguments.size())) {
        return command_arguments[number];
    } else {
        return std::string();
    }
}